

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  size_t sVar2;
  ulong uVar3;
  char *buffer;
  double value;
  int length;
  int local_dc;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  char local_b8 [136];
  
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"[",1);
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(ofs,", ",2);
        pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      value = pdVar1[uVar3];
      if (NAN(value)) {
        __assert_fail("!std::isnan(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/dtoa_milo.h"
                      ,0x191,"void dtoa_milo(double, char *)");
      }
      if (ABS(value) == INFINITY) {
        __assert_fail("!std::isinf(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/dtoa_milo.h"
                      ,0x192,"void dtoa_milo(double, char *)");
      }
      if (2.220446049250313e-16 <= ABS(value)) {
        if (0.0 <= value) {
          buffer = local_b8;
        }
        else {
          local_b8[0] = 0x2d;
          value = -value;
          buffer = local_b8 + 1;
        }
        Grisu2(value,buffer,(int *)&local_d8,&local_dc);
        Prettify(buffer,(int)local_d8,local_dc);
      }
      else {
        builtin_strncpy(local_b8,"0.0",4);
      }
      local_d8 = local_c8;
      sVar2 = strlen(local_b8);
      __cxx11::string::_M_construct<char_const*>((string *)&local_d8,local_b8,local_b8 + sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(ofs,(char *)local_d8,local_d0);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      uVar3 = uVar3 + 1;
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"]",1);
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<double> &v) {
  // Not sure what is the HARD-LIMT buffer length for dtoa_milo,
  // but according to std::numeric_limits<double>::digits10(=15),
  // 32 should be sufficient, but allocate 128 just in case
  char buf[128];

  // TODO: multi-threading for further performance gain?

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
    dtoa_milo(v[i], buf);
    ofs << std::string(buf);
  }
  ofs << "]";

  return ofs;
}